

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O1

void __thiscall libcellml::Model::~Model(Model *this)

{
  int *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Atomic_word *p_Var3;
  EntityImpl *pEVar4;
  long *plVar5;
  EntityImpl *pEVar6;
  long *plVar7;
  pointer pcVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  int iVar10;
  
  (this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity._vptr_Entity =
       (_func_int **)&PTR__Model_002f6000;
  pEVar4 = (this->super_ComponentEntity).super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl;
  if (pEVar4 != (EntityImpl *)0x0) {
    std::
    vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>::
    ~vector((vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
             *)&pEVar4[4].mId._M_string_length);
    plVar5 = (long *)pEVar4[3].mId._M_string_length;
    plVar7 = (long *)((long)&pEVar4[3].mId.field_2 + 8);
    if (plVar5 != plVar7) {
      operator_delete(plVar5,*plVar7 + 1);
    }
    std::
    vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
    ::~vector((vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
               *)&pEVar4[2].mId.field_2);
    pEVar6 = (EntityImpl *)pEVar4[1].mId.field_2._M_allocated_capacity;
    if (pEVar6 != pEVar4 + 2) {
      operator_delete(pEVar6,(ulong)(pEVar4[2].mId._M_dataplus._M_p + 1));
    }
    plVar7 = (long *)pEVar4[1].mId._M_string_length;
    if (plVar7 != (long *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        piVar1 = (int *)((long)plVar7 + 0xc);
        iVar10 = *piVar1;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
      }
      else {
        iVar10 = *(int *)((long)plVar7 + 0xc);
        *(int *)((long)plVar7 + 0xc) = iVar10 + -1;
      }
      if (iVar10 == 1) {
        (**(code **)(*plVar7 + 0x18))();
      }
    }
    pcVar8 = (pEVar4->mId)._M_dataplus._M_p;
    paVar2 = &(pEVar4->mId).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar8 != paVar2) {
      operator_delete(pcVar8,paVar2->_M_allocated_capacity + 1);
    }
    operator_delete(pEVar4,0xa0);
  }
  p_Var9 = (this->super_enable_shared_from_this<libcellml::Model>)._M_weak_this.
           super___weak_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3 = &p_Var9->_M_weak_count;
      iVar10 = *p_Var3;
      *p_Var3 = *p_Var3 + -1;
      UNLOCK();
    }
    else {
      iVar10 = p_Var9->_M_weak_count;
      p_Var9->_M_weak_count = iVar10 + -1;
    }
    if (iVar10 == 1) {
      (*p_Var9->_vptr__Sp_counted_base[3])();
    }
  }
  Entity::~Entity((Entity *)this);
  return;
}

Assistant:

Model::~Model()
{
    delete pFunc();
}